

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static-var-tests.cpp
# Opt level: O2

void StaticVarTest(bool *result)

{
  StaticVarsTestClass *this;
  undefined8 uVar1;
  undefined8 uStack_40;
  uint64_t memLeakSize;
  uint64_t staticMemSize;
  size_t memLeakCount;
  size_t staticMemCount;
  
  __start(false,"",false);
  this = (StaticVarsTestClass *)operator_new(0x10);
  StaticVarsTestClass::StaticVarsTestClass(this);
  __static_mem_check(&staticMemCount,&staticMemSize,false,"",false);
  if (staticMemCount == 4) {
    if (staticMemSize == 0x20) {
      __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
      if (memLeakCount == 2) {
        if (memLeakSize == 0x18) {
          StaticVarsTestClass::~StaticVarsTestClass(this);
          operator_delete(this,0x10);
          __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
          if ((memLeakCount == 0) && (memLeakCount = memLeakSize, memLeakSize == 0)) {
            __stop_and_free_all_mem();
            return;
          }
          uVar1 = 0x49;
          uStack_40 = 0;
        }
        else {
          uVar1 = 0x45;
          uStack_40 = 0x18;
          memLeakCount = memLeakSize;
        }
      }
      else {
        uVar1 = 0x45;
        uStack_40 = 2;
      }
    }
    else {
      uVar1 = 0x43;
      uStack_40 = 0x20;
      memLeakCount = staticMemSize;
    }
  }
  else {
    uVar1 = 0x42;
    uStack_40 = 4;
    memLeakCount = staticMemCount;
  }
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","StaticVarTest",uVar1,
         memLeakCount,uStack_40);
  *result = false;
  return;
}

Assistant:

TEST_CASE(StaticVarTest) {

    START_TEST;

    StaticVarsTestClass* var1 = new StaticVarsTestClass();

    size_t staticMemCount;
    uint64_t staticMemSize;
    MemPlumber::staticMemCheck(staticMemCount, staticMemSize);
    TEST_ASSERT_EQUAL(staticMemCount, 4);
    TEST_ASSERT_EQUAL(staticMemSize, sizeof(StaticClass) + sizeof(int) + sizeof(StaticVarsTestClass) + sizeof(uint64_t));

    CHECK_MEM_LEAK(2, sizeof(StaticVarsTestClass) + sizeof(uint64_t));

    delete var1;

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}